

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bassigngets(bstring b,bNgetc getcPtr,void *parm,char terminator)

{
  int iVar1;
  int iVar2;
  bool local_39;
  int local_38;
  int local_34;
  int e;
  int d;
  int c;
  char terminator_local;
  void *parm_local;
  bNgetc getcPtr_local;
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (b->mlen < 1)) || (b->slen < 0)) ||
     (((b->mlen < b->slen || (b->mlen < 1)) || (getcPtr == (bNgetc)0x0)))) {
    b_local._4_4_ = 0xffffffff;
  }
  else {
    local_34 = 0;
    local_38 = b->mlen + -2;
    do {
      iVar1 = (*getcPtr)(parm);
      if (iVar1 < 0) break;
      if (local_38 < local_34) {
        b->slen = local_34;
        iVar2 = balloc(b,local_34 + 2);
        if (iVar2 != 0) {
          return -1;
        }
        local_38 = b->mlen + -2;
      }
      b->data[local_34] = (uchar)iVar1;
      local_34 = local_34 + 1;
    } while (iVar1 != terminator);
    b->data[local_34] = '\0';
    b->slen = local_34;
    local_39 = local_34 == 0 && iVar1 < 0;
    b_local._4_4_ = (uint)local_39;
  }
  return b_local._4_4_;
}

Assistant:

int bassigngets (bstring b, bNgetc getcPtr, void * parm, char terminator) {
int c, d, e;

	if (b == NULL || b->mlen <= 0 || b->slen < 0 || b->mlen < b->slen ||
	    b->mlen <= 0 || getcPtr == NULL) return BSTR_ERR;
	d = 0;
	e = b->mlen - 2;

	while ((c = getcPtr (parm)) >= 0) {
		if (d > e) {
			b->slen = d;
			if (balloc (b, d + 2) != BSTR_OK) return BSTR_ERR;
			e = b->mlen - 2;
		}
		b->data[d] = (unsigned char) c;
		d++;
		if (c == terminator) break;
	}

	b->data[d] = (unsigned char) '\0';
	b->slen = d;

	return d == 0 && c < 0;
}